

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_BufferManager.cc
# Opt level: O0

MyDB_PageHandle __thiscall
MyDB_BufferManager::getPage(MyDB_BufferManager *this,MyDB_TablePtr *table,long index)

{
  bool bVar1;
  pointer ppVar2;
  MyDB_PageBase *pMVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  MyDB_PageHandle MVar6;
  pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*> local_b0;
  undefined1 local_89;
  pair<std::shared_ptr<MyDB_Table>,_long> local_88;
  MyDB_PageBase *local_70;
  MyDB_PageBase *newPage;
  _Self local_60;
  iterator it_pageMap;
  undefined1 local_48 [8];
  pair<std::shared_ptr<MyDB_Table>,_long> curId;
  long local_28;
  long index_local;
  MyDB_TablePtr *table_local;
  MyDB_BufferManager *this_local;
  MyDB_PageHandle *phd;
  
  curId.second._7_1_ = 0;
  index_local = index;
  table_local = table;
  this_local = this;
  std::make_shared<MyDB_PageHandleBase>();
  std::pair<std::shared_ptr<MyDB_Table>,_long>::pair<std::shared_ptr<MyDB_Table>_&,_long_&,_true>
            ((pair<std::shared_ptr<MyDB_Table>,_long> *)local_48,(shared_ptr<MyDB_Table> *)index,
             &local_28);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
       ::find((map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
               *)table,(key_type *)local_48);
  newPage = (MyDB_PageBase *)
            std::
            map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
            ::end((map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
                   *)table);
  bVar1 = std::operator!=(&local_60,(_Self *)&newPage);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>
             ::operator->(&local_60);
    pMVar3 = ppVar2->second;
    peVar4 = std::__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar4->pagePtr = pMVar3;
  }
  else {
    pMVar3 = (MyDB_PageBase *)operator_new(0x38);
    local_89 = 1;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair
              (&local_88,(pair<std::shared_ptr<MyDB_Table>,_long> *)local_48);
    MyDB_PageBase::MyDB_PageBase
              (pMVar3,(void *)0x0,false,0xffffffffffffffff,false,0,&local_88,
               (MyDB_BufferManager *)table);
    local_89 = 0;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair(&local_88);
    local_70 = pMVar3;
    std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>::
    pair<std::pair<std::shared_ptr<MyDB_Table>,_long>_&,_MyDB_PageBase_*&,_true>
              (&local_b0,(pair<std::shared_ptr<MyDB_Table>,_long> *)local_48,&local_70);
    std::
    map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
    ::insert((map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>_>_>
              *)table,&local_b0);
    std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_MyDB_PageBase_*>::~pair(&local_b0)
    ;
    pMVar3 = local_70;
    peVar4 = std::__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar4->pagePtr = pMVar3;
  }
  peVar4 = std::__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4->pagePtr->handleCount = peVar4->pagePtr->handleCount + 1;
  peVar4 = std::__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4->bufferManager = (MyDB_BufferManager *)table;
  curId.second._7_1_ = 1;
  std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair
            ((pair<std::shared_ptr<MyDB_Table>,_long> *)local_48);
  _Var5._M_pi = extraout_RDX;
  if ((curId.second._7_1_ & 1) == 0) {
    std::shared_ptr<MyDB_PageHandleBase>::~shared_ptr((shared_ptr<MyDB_PageHandleBase> *)this);
    _Var5._M_pi = extraout_RDX_00;
  }
  MVar6.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  MVar6.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MyDB_PageHandle)MVar6.super___shared_ptr<MyDB_PageHandleBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MyDB_PageHandle MyDB_BufferManager :: getPage (MyDB_TablePtr table, long index) {
	// the handle we will return
	MyDB_PageHandle phd = make_shared<MyDB_PageHandleBase>();
	// Find if this page is in the buffer
	pair<MyDB_TablePtr, long> curId(table, index);
	map<pair<MyDB_TablePtr, long>, MyDB_PageBase*>:: iterator it_pageMap = pageMap.find(curId);

	//If find this page in buffer
	if (it_pageMap != pageMap.end()) {
		phd -> pagePtr = it_pageMap -> second;
	}

	//If this page is in the disk and we need to put it in the buffer
	else {
		//New one page with null buffer address
		MyDB_PageBase* newPage = new MyDB_PageBase (nullptr, false, -1, false, 0, curId, this);
		// Update pageMap
		pageMap.insert(map<pair<MyDB_TablePtr, long>, MyDB_PageBase*>::value_type(curId, newPage));
		phd -> pagePtr = newPage;
	}

	//Update the handleCount of this page and add this new handle's buffer information
	phd -> pagePtr -> handleCount ++;
	phd->bufferManager = this;
	return phd;

}